

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  test_impl *p;
  ostream *poVar1;
  consumer *this;
  string local_50;
  consumer test_consumer;
  injected<consumer> i_consumer;
  
  inject::context<0>::injected<consumer>::injected(&i_consumer);
  p = (test_impl *)operator_new(8);
  (p->super_service)._vptr_service = (_func_int **)&PTR_name_abi_cxx11__00112718;
  boost::shared_ptr<service>::shared_ptr<test_impl>((shared_ptr<service> *)&local_50,p);
  test_consumer._service.px = (element_type *)local_50._M_dataplus._M_p;
  test_consumer._service.pn.pi_ = (sp_counted_base *)local_50._M_string_length;
  if ((sp_counted_base *)local_50._M_string_length != (sp_counted_base *)0x0) {
    LOCK();
    *(uint_least32_t *)(local_50._M_string_length + 8) =
         *(uint_least32_t *)(local_50._M_string_length + 8) + 1;
    UNLOCK();
  }
  boost::detail::shared_count::~shared_count((shared_count *)&local_50._M_string_length);
  poVar1 = std::operator<<((ostream *)&std::cout,"with injected struct service name is \'");
  this = inject::context<0>::injected<consumer>::operator->(&i_consumer);
  consumer::service_name_abi_cxx11_(&local_50,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,"with test struct service name is \'");
  consumer::service_name_abi_cxx11_(&local_50,&test_consumer);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,"\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_50);
  boost::detail::shared_count::~shared_count(&test_consumer._service.pn);
  boost::detail::shared_count::~shared_count(&i_consumer._ptr.pn);
  return 0;
}

Assistant:

int main() {

    // request an instance with injected service
    context<>::injected<consumer> i_consumer;

    // manually create an instance with test service
    consumer test_consumer(
        consumer::service_ptr(new test_impl()));

    cout << "with injected struct service name is '" <<
        i_consumer->service_name() << "'" << endl;
    
    cout << "with test struct service name is '" <<
        test_consumer.service_name() << "'" << endl;

    return 0;
}